

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O1

const_iterator * __thiscall
gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end
          (const_iterator *__return_storage_ptr__,
          StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *this)

{
  int iVar1;
  int iVar2;
  Input **ppIVar3;
  
  iVar2 = this->bsize;
  ppIVar3 = this->dataptr;
  if ((long)iVar2 == 0x20) {
    if (ppIVar3 == (Input **)0x0) {
      ppIVar3 = &end::emptyValue;
    }
    else {
      ppIVar3 = ppIVar3 + (long)this->dataSlotIndex + 1;
    }
    __return_storage_ptr__->vec = ppIVar3;
    __return_storage_ptr__->ptr = *ppIVar3;
    iVar2 = 0;
  }
  else {
    iVar1 = this->dataSlotIndex;
    __return_storage_ptr__->vec = ppIVar3 + iVar1;
    __return_storage_ptr__->ptr = ppIVar3[iVar1] + iVar2;
  }
  __return_storage_ptr__->offset = iVar2;
  return __return_storage_ptr__;
}

Assistant:

const_iterator end() const
        {
            static const X* const emptyValue{nullptr};
            if (bsize == blockSize) {
                const X* const* ptr = (dataptr != nullptr) ?
                    &(dataptr[dataSlotIndex + 1]) :
                    &emptyValue;
                return {ptr, 0};
            }
            const X* const* ptr = &(dataptr[dataSlotIndex]);
            return {ptr, bsize};
        }